

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  IString x;
  IString x_00;
  IString x_01;
  IString x_02;
  IString x_03;
  IString x_04;
  IString x_05;
  IString x_06;
  IString x_07;
  IString x_08;
  byte bVar1;
  bool bVar2;
  string *psVar3;
  long lVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  char *pcVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  Ref *pRVar9;
  element_type *peVar10;
  __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var11;
  string_view *psVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  bool *pbVar14;
  size_t sVar15;
  mapped_type *pmVar16;
  mapped_type *this;
  size_type sVar17;
  ImportId IVar18;
  allocator<char> local_2119;
  key_type local_2118;
  string local_20f8 [32];
  undefined1 local_20d8 [8];
  ModuleWriter writer;
  key_type local_2068;
  size_t local_2048;
  char *pcStack_2040;
  string_view local_2038;
  size_t local_2028;
  char *pcStack_2020;
  string_view local_2010;
  undefined1 local_2000 [8];
  ImportId id;
  undefined1 local_1e58 [8];
  Ref imp;
  Name local_1e28;
  size_t local_1e18;
  char *pcStack_1e10;
  Name local_1e00;
  Fatal local_1df0;
  char *local_1c68;
  size_t sStack_1c60;
  undefined1 local_1c58 [8];
  Ref exp;
  Fatal local_1c20;
  char *local_1a98;
  size_t sStack_1a90;
  undefined1 local_1a88 [8];
  Ref root;
  Name local_1a58;
  Fatal local_1a48;
  undefined1 local_18c0 [8];
  Ref name;
  size_t j;
  size_t size_1;
  char *local_1718;
  size_t sStack_1710;
  undefined1 local_1708 [8];
  Ref reaches;
  string_view local_16c8;
  undefined1 local_16b8 [8];
  DCENode node;
  Fatal local_14f8;
  undefined1 local_1370 [8];
  Ref ref;
  size_t i;
  size_t size;
  undefined1 local_11c8 [8];
  MetaDCEGraph graph;
  IString IMPORT;
  IString EXPORT;
  IString ROOT;
  IString REACHES;
  IString NAME;
  Value outside;
  char *copy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> graphInput;
  undefined1 local_cf9 [401];
  ParseException *p;
  string local_b60 [39];
  allocator<char> local_b39;
  key_type local_b38;
  string local_b18 [36];
  undefined1 local_af4 [8];
  ModuleReader reader;
  Module wasm;
  key_type local_798;
  string local_778 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  anon_class_1_0_00000001 local_5c9;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_5c8;
  allocator<char> local_5a1;
  string local_5a0 [32];
  anon_class_8_1_898ae6f2 local_580;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_578;
  allocator<char> local_551;
  string local_550 [39];
  allocator<char> local_529;
  string local_528 [39];
  allocator<char> local_501;
  string local_500 [32];
  anon_class_8_1_cf9d5a8a local_4e0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_4d8;
  allocator<char> local_4b1;
  string local_4b0 [39];
  allocator<char> local_489;
  string local_488 [39];
  allocator<char> local_461;
  string local_460 [32];
  anon_class_8_1_09c29441 local_440;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_438;
  allocator<char> local_411;
  string local_410 [39];
  allocator<char> local_3e9;
  string local_3e8 [39];
  allocator<char> local_3c1;
  string local_3c0 [32];
  anon_class_8_1_29de6772 local_3a0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_398;
  allocator<char> local_371;
  string local_370 [39];
  allocator<char> local_349;
  string local_348 [39];
  allocator<char> local_321;
  string local_320 [39];
  anon_class_1_0_00000001 local_2f9;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2f8;
  allocator<char> local_2d1;
  string local_2d0 [39];
  allocator<char> local_2a9;
  string local_2a8 [39];
  allocator<char> local_281;
  string local_280 [39];
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  undefined1 local_210 [8];
  ToolOptions options;
  allocator<char> local_91;
  string local_90 [8];
  string WasmMetaDCEOption;
  undefined1 local_68 [7];
  bool dump;
  string graphFile;
  undefined1 local_40 [6];
  bool debugInfo;
  bool emitBinary;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passes;
  Name entry;
  char **argv_local;
  int argc_local;
  
  ::wasm::Name::Name((Name *)&passes.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  graphFile.field_2._M_local_buf[0xf] = '\x01';
  graphFile.field_2._M_local_buf[0xe] = '\0';
  std::__cxx11::string::string((string *)local_68);
  WasmMetaDCEOption.field_2._M_local_buf[0xf] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"wasm-opt options",&local_91);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"wasm-metadce",&local_231)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "This tool performs dead code elimination (DCE) on a larger space that the wasm module is just a part of. For example, if you have JS and wasm that are connected, this can DCE the combined graph. By doing so, it is able to eliminate wasm module exports, which otherwise regular optimizations cannot.\n\nThis tool receives a representation of the reachability graph that the wasm module resides in, which contains abstract nodes and connections showing what they reach. Some of those nodes can represent the wasm module\'s imports and exports. The tool then completes the graph by adding the internal parts of the module, and does DCE on the entire thing.\n\nThis tool will output a wasm module with dead code eliminated, and metadata describing the things in the rest of the graph that can be eliminated as well.\n\nThe graph description file should represent the graph in the following JSON-like notation (note, this is not true JSON, things like comments, escaping, single-quotes, etc. are not supported):\n\n  [\n    {\n      \"name\": \"entity1\",\n      \"reaches\": [\"entity2, \"entity3\"],\n      \"root\": true\n    },\n    {\n      \"name\": \"entity2\",\n      \"reaches\": [\"entity1, \"entity4\"]\n    },\n    {\n      \"name\": \"entity3\",\n      \"reaches\": [\"entity1\"],\n      \"export\": \"export1\"\n    },\n    {\n      \"name\": \"entity4\",\n      \"import\": [\"module\", \"import1\"]\n    },\n  ]\n\nEach entity has a name and an optional list of the other entities it reaches. It can also be marked as a root, export (with the export string), or import (with the module and import strings). DCE then computes what is reachable from the roots."
             ,&local_259);
  ::wasm::ToolOptions::ToolOptions((ToolOptions *)local_210,&local_230,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_280,"--output",&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"-o",&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d0,"Output file (stdout if not specified)",&local_2d1);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__0,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_2f8,&local_2f9);
  psVar3 = (string *)
           ::wasm::Options::add
                     ((string *)local_210,local_280,local_2a8,local_2d0,(Arguments)local_90,
                      (function *)0x1,SUB81(&local_2f8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_320,"--emit-text",&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_348,"-S",&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_370,"Emit text instead of binary for the output file",&local_371);
  local_3a0.emitBinary = (bool *)((long)&graphFile.field_2 + 0xf);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__1,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_398,&local_3a0);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_320,local_348,local_370,(Arguments)local_90,(function *)0x0,
                      SUB81(&local_398,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"--debuginfo",&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e8,"-g",&local_3e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_410,"Emit names section and debug info",&local_411);
  local_440.debugInfo = (bool *)((long)&graphFile.field_2 + 0xe);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__2,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_438,&local_440);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_3c0,local_3e8,local_410,(Arguments)local_90,(function *)0x0,
                      SUB81(&local_438,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_460,"--graph-file",&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_488,"-f",&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4b0,"Filename of the graph description file",&local_4b1);
  local_4e0.graphFile = (string *)local_68;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__3,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_4d8,&local_4e0);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_460,local_488,local_4b0,(Arguments)local_90,(function *)0x1,
                      SUB81(&local_4d8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_500,"--dump",&local_501);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_528,"-d",&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_550,"Dump the combined graph file (useful for debugging)",&local_551);
  local_580.dump = (bool *)((long)&WasmMetaDCEOption.field_2 + 0xf);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__4,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_578,&local_580);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_500,local_528,local_550,(Arguments)local_90,(function *)0x0,
                      SUB81(&local_578,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"INFILE",&local_5a1);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__5,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_5c8,&local_5c9);
  ::wasm::Options::add_positional(psVar3,(Arguments)local_5a0,(function *)0x1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_5c8);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator(&local_5a1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_578);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator(&local_551);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator(&local_529);
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::~allocator(&local_501);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_4d8);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator(&local_489);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_438);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator(&local_411);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_398);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator(&local_371);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator(&local_349);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2f8);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator(&local_281);
  ::wasm::Options::parse((int)local_210,(char **)(ulong)(uint)argc);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 == 0) {
    ::wasm::Fatal::Fatal((Fatal *)((long)&input.field_2 + 8));
    ::wasm::Fatal::operator<<
              ((Fatal *)((long)&input.field_2 + 8),(char (*) [24])"no graph file provided.");
    ::wasm::Fatal::~Fatal((Fatal *)((long)&input.field_2 + 8));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_798,"infile",
             (allocator<char> *)((long)&wasm.tagsMap._M_h._M_single_bucket + 7));
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options,&local_798);
  ::wasm::read_file<std::__cxx11::string>(local_778,(BinaryOption)pmVar5);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&wasm.tagsMap._M_h._M_single_bucket + 7));
  ::wasm::Module::Module((Module *)&reader.profile);
  ::wasm::ToolOptions::applyFeatures((ToolOptions *)local_210,(Module *)&reader.profile);
  if (((byte)local_210[0] & 1) != 0) {
    std::operator<<((ostream *)&std::cerr,"reading...\n");
  }
  ::wasm::ModuleReader::ModuleReader((ModuleReader *)local_af4);
  ::wasm::ModuleReader::setDWARF
            ((ModuleReader *)local_af4,(bool)(graphFile.field_2._M_local_buf[0xe] & 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b38,"infile",&local_b39);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options,&local_b38);
  std::__cxx11::string::string(local_b18,(string *)pmVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b60,"",(allocator<char> *)((long)&p + 7))
  ;
  ::wasm::ModuleReader::read(local_af4,local_b18,&reader.profile,local_b60);
  std::__cxx11::string::~string(local_b60);
  std::allocator<char>::~allocator((allocator<char> *)((long)&p + 7));
  std::__cxx11::string::~string(local_b18);
  std::__cxx11::string::~string((string *)&local_b38);
  std::allocator<char>::~allocator(&local_b39);
  if (((options._169_1_ & 1) != 0) &&
     (bVar1 = ::wasm::WasmValidator::validate((Module *)local_cf9,(int)&reader + 4),
     ((bVar1 ^ 0xff) & 1) != 0)) {
    poVar6 = (ostream *)std::operator<<((ostream *)&std::cout,(Module *)&reader.profile);
    std::operator<<(poVar6,'\n');
    ::wasm::Fatal::Fatal((Fatal *)((long)&graphInput.field_2 + 8));
    ::wasm::Fatal::operator<<
              ((Fatal *)((long)&graphInput.field_2 + 8),(char (*) [26])"error in validating input");
    ::wasm::Fatal::~Fatal((Fatal *)((long)&graphInput.field_2 + 8));
  }
  ::wasm::read_file<std::__cxx11::string>((string *)&copy,(BinaryOption)local_68);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  pcVar7 = strdup(pcVar7);
  json::Value::Value((Value *)&NAME.str._M_str);
  json::Value::parse((Value *)&NAME.str._M_str,pcVar7);
  ::wasm::IString::IString((IString *)&REACHES.str._M_str,"name");
  ::wasm::IString::IString((IString *)&ROOT.str._M_str,"reaches");
  ::wasm::IString::IString((IString *)&EXPORT.str._M_str,"root");
  ::wasm::IString::IString((IString *)&IMPORT.str._M_str,"export");
  ::wasm::IString::IString((IString *)&graph.reached._M_h._M_single_bucket,"import");
  MetaDCEGraph::MetaDCEGraph((MetaDCEGraph *)local_11c8,(Module *)&reader.profile);
  bVar2 = json::Value::isArray((Value *)&NAME.str._M_str);
  if (!bVar2) {
    ::wasm::Fatal::Fatal((Fatal *)&size);
    ::wasm::Fatal::operator<<
              ((Fatal *)&size,
               (char (*) [67])"input graph must be a JSON array of nodes. see --help for the form");
    ::wasm::Fatal::~Fatal((Fatal *)&size);
  }
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           json::Value::size((Value *)&NAME.str._M_str);
  ref.super_shared_ptr<json::Value>.super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  do {
    if (p_Var8 <= ref.super_shared_ptr<json::Value>.
                  super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
      MetaDCEGraph::scanWebAssembly((MetaDCEGraph *)local_11c8);
      if ((WasmMetaDCEOption.field_2._M_local_buf[0xf] & 1U) != 0) {
        MetaDCEGraph::dump((MetaDCEGraph *)local_11c8);
      }
      MetaDCEGraph::deadCodeElimination((MetaDCEGraph *)local_11c8);
      MetaDCEGraph::apply((MetaDCEGraph *)local_11c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2068,"output",
                 (allocator<char> *)(writer.sourceMapUrl.field_2._M_local_buf + 0xf));
      sVar17 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&options,&local_2068);
      std::__cxx11::string::~string((string *)&local_2068);
      std::allocator<char>::~allocator
                ((allocator<char> *)(writer.sourceMapUrl.field_2._M_local_buf + 0xf));
      if (sVar17 != 0) {
        ::wasm::ModuleWriter::ModuleWriter((ModuleWriter *)local_20d8);
        ::wasm::ModuleWriter::setBinary
                  ((ModuleWriter *)local_20d8,(bool)(graphFile.field_2._M_local_buf[0xf] & 1));
        ::wasm::ModuleIOBase::setDebugInfo
                  ((ModuleIOBase *)local_20d8,(bool)(graphFile.field_2._M_local_buf[0xe] & 1));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2118,"output",&local_2119);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&options,&local_2118);
        std::__cxx11::string::string(local_20f8,(string *)pmVar5);
        ::wasm::ModuleWriter::write(local_20d8,&reader.profile,local_20f8);
        std::__cxx11::string::~string(local_20f8);
        std::__cxx11::string::~string((string *)&local_2118);
        std::allocator<char>::~allocator(&local_2119);
        ::wasm::ModuleWriter::~ModuleWriter((ModuleWriter *)local_20d8);
      }
      MetaDCEGraph::printAllUnused((MetaDCEGraph *)local_11c8);
      free(pcVar7);
      MetaDCEGraph::~MetaDCEGraph((MetaDCEGraph *)local_11c8);
      json::Value::~Value((Value *)&NAME.str._M_str);
      std::__cxx11::string::~string((string *)&copy);
      ::wasm::Module::~Module((Module *)&reader.profile);
      std::__cxx11::string::~string(local_778);
      ::wasm::ToolOptions::~ToolOptions((ToolOptions *)local_210);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string((string *)local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
      return 0;
    }
    pRVar9 = json::Value::operator[]
                       ((Value *)&NAME.str._M_str,
                        (uint)ref.super_shared_ptr<json::Value>.
                              super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi);
    json::Value::Ref::Ref((Ref *)local_1370,pRVar9);
    peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_1370);
    bVar2 = json::Value::isObject(peVar10);
    if (!bVar2) {
      ::wasm::Fatal::Fatal(&local_14f8);
      ::wasm::Fatal::operator<<
                (&local_14f8,
                 (char (*) [67])"nodes in input graph must be JSON objects. see --help for the form"
                );
      ::wasm::Fatal::~Fatal(&local_14f8);
    }
    peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_1370);
    x_08.str._M_str = (char *)NAME.str._M_len;
    x_08.str._M_len = (size_t)REACHES.str._M_str;
    bVar2 = json::Value::has(peVar10,x_08);
    if (!bVar2) {
      ::wasm::Fatal::Fatal
                ((Fatal *)&node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      ::wasm::Fatal::operator<<
                ((Fatal *)&node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (char (*) [63])"nodes in input graph must have a name. see --help for the form");
      ::wasm::Fatal::~Fatal
                ((Fatal *)&node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    x_07.str._M_str = (char *)NAME.str._M_len;
    x_07.str._M_len = (size_t)REACHES.str._M_str;
    p_Var11 = (__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              json::Value::Ref::operator[]((Ref *)local_1370,x_07);
    peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(p_Var11);
    psVar12 = &json::Value::getIString(peVar10)->str;
    ::wasm::Name::Name((Name *)&local_16c8,(IString)*psVar12);
    DCENode::DCENode((DCENode *)local_16b8,(Name)local_16c8);
    peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_1370);
    reaches.super_shared_ptr<json::Value>.
    super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ROOT.str._M_str;
    x_06.str._M_str = (char *)REACHES.str._M_len;
    x_06.str._M_len = (size_t)ROOT.str._M_str;
    bVar2 = json::Value::has(peVar10,x_06);
    if (bVar2) {
      local_1718 = ROOT.str._M_str;
      sStack_1710 = REACHES.str._M_len;
      x_05.str._M_str = (char *)REACHES.str._M_len;
      x_05.str._M_len = (size_t)ROOT.str._M_str;
      pRVar9 = json::Value::Ref::operator[]((Ref *)local_1370,x_05);
      json::Value::Ref::Ref((Ref *)local_1708,pRVar9);
      peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1708);
      bVar2 = json::Value::isArray(peVar10);
      if (!bVar2) {
        ::wasm::Fatal::Fatal((Fatal *)&size_1);
        ::wasm::Fatal::operator<<
                  ((Fatal *)&size_1,
                   (char (*) [55])"node.reaches must be an array. see --help for the form");
        ::wasm::Fatal::~Fatal((Fatal *)&size_1);
      }
      peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1708);
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)json::Value::size(peVar10);
      for (name.super_shared_ptr<json::Value>.
           super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          name.super_shared_ptr<json::Value>.
          super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi < p_Var13;
          name.super_shared_ptr<json::Value>.
          super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(name.super_shared_ptr<json::Value>.
                        super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_vptr__Sp_counted_base + 1)) {
        pRVar9 = json::Value::Ref::operator[]
                           ((Ref *)local_1708,
                            (size_t)name.super_shared_ptr<json::Value>.
                                    super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi);
        json::Value::Ref::Ref((Ref *)local_18c0,pRVar9);
        peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_18c0);
        bVar2 = json::Value::isString(peVar10);
        if (!bVar2) {
          ::wasm::Fatal::Fatal(&local_1a48);
          ::wasm::Fatal::operator<<
                    (&local_1a48,
                     (char (*) [60])"node.reaches items must be strings. see --help for the form");
          ::wasm::Fatal::~Fatal(&local_1a48);
        }
        peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_18c0);
        psVar12 = &json::Value::getIString(peVar10)->str;
        ::wasm::Name::Name(&local_1a58,(IString)*psVar12);
        std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                  ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                   &node.name.super_IString.str._M_str,&local_1a58);
        json::Value::Ref::~Ref((Ref *)local_18c0);
      }
      json::Value::Ref::~Ref((Ref *)local_1708);
    }
    peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_1370);
    root.super_shared_ptr<json::Value>.super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)EXPORT.str._M_str;
    x_04.str._M_str = (char *)ROOT.str._M_len;
    x_04.str._M_len = (size_t)EXPORT.str._M_str;
    bVar2 = json::Value::has(peVar10,x_04);
    if (bVar2) {
      local_1a98 = EXPORT.str._M_str;
      sStack_1a90 = ROOT.str._M_len;
      x_03.str._M_str = (char *)ROOT.str._M_len;
      x_03.str._M_len = (size_t)EXPORT.str._M_str;
      pRVar9 = json::Value::Ref::operator[]((Ref *)local_1370,x_03);
      json::Value::Ref::Ref((Ref *)local_1a88,pRVar9);
      peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1a88);
      bVar2 = json::Value::isBool(peVar10);
      if (!bVar2) {
LAB_0014c0b2:
        ::wasm::Fatal::Fatal(&local_1c20);
        ::wasm::Fatal::operator<<
                  (&local_1c20,
                   (char (*) [63])"node.root, if it exists, must be true. see --help for the form");
        ::wasm::Fatal::~Fatal(&local_1c20);
      }
      peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1a88);
      pbVar14 = json::Value::getBool(peVar10);
      if ((*pbVar14 & 1U) == 0) goto LAB_0014c0b2;
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                *)&graph.nodes._M_h._M_single_bucket,(value_type *)local_16b8);
      json::Value::Ref::~Ref((Ref *)local_1a88);
    }
    peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_1370);
    exp.super_shared_ptr<json::Value>.super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IMPORT.str._M_str;
    x_02.str._M_str = (char *)EXPORT.str._M_len;
    x_02.str._M_len = (size_t)IMPORT.str._M_str;
    bVar2 = json::Value::has(peVar10,x_02);
    if (bVar2) {
      local_1c68 = IMPORT.str._M_str;
      sStack_1c60 = EXPORT.str._M_len;
      x_01.str._M_str = (char *)EXPORT.str._M_len;
      x_01.str._M_len = (size_t)IMPORT.str._M_str;
      pRVar9 = json::Value::Ref::operator[]((Ref *)local_1370,x_01);
      json::Value::Ref::Ref((Ref *)local_1c58,pRVar9);
      peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1c58);
      bVar2 = json::Value::isString(peVar10);
      if (!bVar2) {
        ::wasm::Fatal::Fatal(&local_1df0);
        ::wasm::Fatal::operator<<
                  (&local_1df0,
                   (char (*) [69])
                   "node.export, if it exists, must be a string. see --help for the form");
        ::wasm::Fatal::~Fatal(&local_1df0);
      }
      peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1c58);
      psVar12 = &json::Value::getIString(peVar10)->str;
      local_1e18 = psVar12->_M_len;
      pcStack_1e10 = psVar12->_M_str;
      ::wasm::Name::Name(&local_1e00,(IString)*psVar12);
      pmVar16 = std::
                unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::operator[]((unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                              *)&graph.roots._M_h._M_single_bucket,&local_1e00);
      ::wasm::Name::operator=(pmVar16,(Name *)local_16b8);
      peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1c58);
      psVar12 = &json::Value::getIString(peVar10)->str;
      ::wasm::Name::Name(&local_1e28,(IString)*psVar12);
      pmVar16 = std::
                unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::operator[]((unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                              *)&graph.tagToDCENode._M_h._M_single_bucket,(key_type *)local_16b8);
      ::wasm::Name::operator=(pmVar16,&local_1e28);
      json::Value::Ref::~Ref((Ref *)local_1c58);
    }
    peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_1370);
    imp.super_shared_ptr<json::Value>.super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)graph.reached._M_h._M_single_bucket;
    x_00.str._M_str = (char *)IMPORT.str._M_len;
    x_00.str._M_len = (size_t)graph.reached._M_h._M_single_bucket;
    bVar2 = json::Value::has(peVar10,x_00);
    if (bVar2) {
      x.str._M_str = (char *)IMPORT.str._M_len;
      x.str._M_len = (size_t)graph.reached._M_h._M_single_bucket;
      pRVar9 = json::Value::Ref::operator[]((Ref *)local_1370,x);
      json::Value::Ref::Ref((Ref *)local_1e58,pRVar9);
      peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1e58);
      bVar2 = json::Value::isArray(peVar10);
      if (!bVar2) {
LAB_0014c52b:
        ::wasm::Fatal::Fatal((Fatal *)&id.super_IString.str._M_str);
        ::wasm::Fatal::operator<<
                  ((Fatal *)&id.super_IString.str._M_str,
                   (char (*) [84])
                   "node.import, if it exists, must be an array of two strings. see --help for the form"
                  );
        ::wasm::Fatal::~Fatal((Fatal *)&id.super_IString.str._M_str);
      }
      peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1e58);
      sVar15 = json::Value::size(peVar10);
      if (sVar15 != 2) goto LAB_0014c52b;
      p_Var11 = (__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                json::Value::Ref::operator[]((Ref *)local_1e58,0);
      peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      bVar2 = json::Value::isString(peVar10);
      if (!bVar2) goto LAB_0014c52b;
      p_Var11 = (__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                json::Value::Ref::operator[]((Ref *)local_1e58,1);
      peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      bVar2 = json::Value::isString(peVar10);
      if (!bVar2) goto LAB_0014c52b;
      p_Var11 = (__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                json::Value::Ref::operator[]((Ref *)local_1e58,0);
      peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      psVar12 = &json::Value::getIString(peVar10)->str;
      local_2028 = psVar12->_M_len;
      pcStack_2020 = psVar12->_M_str;
      ::wasm::Name::Name((Name *)&local_2010,(IString)*psVar12);
      p_Var11 = (__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                json::Value::Ref::operator[]((Ref *)local_1e58,1);
      peVar10 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      psVar12 = &json::Value::getIString(peVar10)->str;
      local_2048 = psVar12->_M_len;
      pcStack_2040 = psVar12->_M_str;
      ::wasm::Name::Name((Name *)&local_2038,(IString)*psVar12);
      IVar18 = MetaDCEGraph::getImportId
                         ((MetaDCEGraph *)local_11c8,(Name)local_2010,(Name)local_2038);
      id.super_IString.str._M_len = IVar18.super_IString.str._M_str;
      local_2000 = IVar18.super_IString.str._M_len;
      pmVar16 = std::
                unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::operator[]((unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                              *)&graph.DCENodeToTag._M_h._M_single_bucket,(key_type *)local_2000);
      ::wasm::Name::operator=(pmVar16,(Name *)local_16b8);
      json::Value::Ref::~Ref((Ref *)local_1e58);
    }
    this = std::
           unordered_map<wasm::Name,_DCENode,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>_>
           ::operator[]((unordered_map<wasm::Name,_DCENode,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>_>
                         *)local_11c8,(key_type *)local_16b8);
    DCENode::operator=(this,(DCENode *)local_16b8);
    DCENode::~DCENode((DCENode *)local_16b8);
    json::Value::Ref::~Ref((Ref *)local_1370);
    ref.super_shared_ptr<json::Value>.super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(ref.super_shared_ptr<json::Value>.
                  super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _vptr__Sp_counted_base + 1);
  } while( true );
}

Assistant:

int main(int argc, const char* argv[]) {
  Name entry;
  std::vector<std::string> passes;
  bool emitBinary = true;
  bool debugInfo = false;
  std::string graphFile;
  bool dump = false;

  const std::string WasmMetaDCEOption = "wasm-opt options";

  ToolOptions options(
    "wasm-metadce",
    "This tool performs dead code elimination (DCE) on a larger space "
    "that the wasm module is just a part of. For example, if you have "
    "JS and wasm that are connected, this can DCE the combined graph. "
    "By doing so, it is able to eliminate wasm module exports, which "
    "otherwise regular optimizations cannot.\n\n"
    "This tool receives a representation of the reachability graph "
    "that the wasm module resides in, which contains abstract nodes "
    "and connections showing what they reach. Some of those nodes "
    "can represent the wasm module's imports and exports. The tool "
    "then completes the graph by adding the internal parts of the "
    "module, and does DCE on the entire thing.\n\n"
    "This tool will output a wasm module with dead code eliminated, "
    "and metadata describing the things in the rest of the graph "
    "that can be eliminated as well.\n\n"
    "The graph description file should represent the graph in the following "
    "JSON-like notation (note, this is not true JSON, things like "
    "comments, escaping, single-quotes, etc. are not supported):\n\n"
    "  [\n"
    "    {\n"
    "      \"name\": \"entity1\",\n"
    "      \"reaches\": [\"entity2, \"entity3\"],\n"
    "      \"root\": true\n"
    "    },\n"
    "    {\n"
    "      \"name\": \"entity2\",\n"
    "      \"reaches\": [\"entity1, \"entity4\"]\n"
    "    },\n"
    "    {\n"
    "      \"name\": \"entity3\",\n"
    "      \"reaches\": [\"entity1\"],\n"
    "      \"export\": \"export1\"\n"
    "    },\n"
    "    {\n"
    "      \"name\": \"entity4\",\n"
    "      \"import\": [\"module\", \"import1\"]\n"
    "    },\n"
    "  ]\n\n"
    "Each entity has a name and an optional list of the other "
    "entities it reaches. It can also be marked as a root, "
    "export (with the export string), or import (with the "
    "module and import strings). DCE then computes what is "
    "reachable from the roots.");

  options
    .add("--output",
         "-o",
         "Output file (stdout if not specified)",
         WasmMetaDCEOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file",
         WasmMetaDCEOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section and debug info",
         WasmMetaDCEOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { debugInfo = true; })
    .add("--graph-file",
         "-f",
         "Filename of the graph description file",
         WasmMetaDCEOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { graphFile = argument; })
    .add("--dump",
         "-d",
         "Dump the combined graph file (useful for debugging)",
         WasmMetaDCEOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { dump = true; })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [](Options* o, const std::string& argument) {
                      o->extra["infile"] = argument;
                    });
  options.parse(argc, argv);

  if (graphFile.size() == 0) {
    Fatal() << "no graph file provided.";
  }

  auto input(read_file<std::string>(options.extra["infile"], Flags::Text));

  Module wasm;
  options.applyFeatures(wasm);

  {
    if (options.debug) {
      std::cerr << "reading...\n";
    }
    ModuleReader reader;
    reader.setDWARF(debugInfo);
    try {
      reader.read(options.extra["infile"], wasm);
    } catch (ParseException& p) {
      p.dump(std::cerr);
      Fatal() << "error in parsing wasm input";
    }
  }

  if (options.passOptions.validate) {
    if (!WasmValidator().validate(wasm)) {
      std::cout << wasm << '\n';
      Fatal() << "error in validating input";
    }
  }

  auto graphInput(read_file<std::string>(graphFile, Flags::Text));
  auto* copy = strdup(graphInput.c_str());
  json::Value outside;
  outside.parse(copy);

  // parse the JSON into our graph, doing all the JSON parsing here, leaving
  // the abstract computation for the class itself
  const json::IString NAME("name");
  const json::IString REACHES("reaches");
  const json::IString ROOT("root");
  const json::IString EXPORT("export");
  const json::IString IMPORT("import");

  MetaDCEGraph graph(wasm);

  if (!outside.isArray()) {
    Fatal()
      << "input graph must be a JSON array of nodes. see --help for the form";
  }
  auto size = outside.size();
  for (size_t i = 0; i < size; i++) {
    json::Ref ref = outside[i];
    if (!ref->isObject()) {
      Fatal()
        << "nodes in input graph must be JSON objects. see --help for the form";
    }
    if (!ref->has(NAME)) {
      Fatal()
        << "nodes in input graph must have a name. see --help for the form";
    }
    DCENode node(ref[NAME]->getIString());
    if (ref->has(REACHES)) {
      json::Ref reaches = ref[REACHES];
      if (!reaches->isArray()) {
        Fatal() << "node.reaches must be an array. see --help for the form";
      }
      auto size = reaches->size();
      for (size_t j = 0; j < size; j++) {
        json::Ref name = reaches[j];
        if (!name->isString()) {
          Fatal()
            << "node.reaches items must be strings. see --help for the form";
        }
        node.reaches.push_back(name->getIString());
      }
    }
    if (ref->has(ROOT)) {
      json::Ref root = ref[ROOT];
      if (!root->isBool() || !root->getBool()) {
        Fatal()
          << "node.root, if it exists, must be true. see --help for the form";
      }
      graph.roots.insert(node.name);
    }
    if (ref->has(EXPORT)) {
      json::Ref exp = ref[EXPORT];
      if (!exp->isString()) {
        Fatal() << "node.export, if it exists, must be a string. see --help "
                   "for the form";
      }
      graph.exportToDCENode[exp->getIString()] = node.name;
      graph.DCENodeToExport[node.name] = exp->getIString();
    }
    if (ref->has(IMPORT)) {
      json::Ref imp = ref[IMPORT];
      if (!imp->isArray() || imp->size() != 2 || !imp[0]->isString() ||
          !imp[1]->isString()) {
        Fatal() << "node.import, if it exists, must be an array of two "
                   "strings. see --help for the form";
      }
      auto id = graph.getImportId(imp[0]->getIString(), imp[1]->getIString());
      graph.importIdToDCENode[id] = node.name;
    }
    // TODO: optimize this copy with a clever move
    graph.nodes[node.name] = node;
  }

  // The external graph is now populated. Scan the module
  graph.scanWebAssembly();

  // Debug dump the graph, if requested
  if (dump) {
    graph.dump();
  }

  // Perform the DCE
  graph.deadCodeElimination();

  // Apply to the wasm
  graph.apply();

  if (options.extra.count("output") > 0) {
    ModuleWriter writer;
    writer.setBinary(emitBinary);
    writer.setDebugInfo(debugInfo);
    writer.write(wasm, options.extra["output"]);
  }

  // Print out everything that we found is removable, the outside might use that
  graph.printAllUnused();

  // Clean up
  free(copy);
}